

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

string * FIX::string_strip(string *__return_storage_ptr__,string *value)

{
  long lVar1;
  ulong uVar2;
  size_t endPos;
  size_t startPos;
  string *value_local;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  }
  else {
    uVar2 = std::__cxx11::string::find_first_not_of((char *)value,0x2c4ef8);
    lVar1 = std::__cxx11::string::find_last_not_of((char *)value,0x2c4ef8);
    if (uVar2 == 0xffffffffffffffff) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)value,uVar2,(lVar1 - uVar2) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string string_strip( const std::string& value )
{
  if( !value.size() )
    return value;

  size_t startPos = value.find_first_not_of(" \t\r\n");
  size_t endPos = value.find_last_not_of(" \t\r\n");

  if( startPos == std::string::npos )
   return value;

  return std::string( value, startPos, endPos - startPos + 1 );
}